

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptNativeIntArray::DirectGetItemAtFull
          (JavascriptNativeIntArray *this,uint32 index,Var *outVal)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  Type *this_00;
  ScriptContext *requestContext_00;
  RecyclableObject *propertyObject;
  ScriptContext *requestContext;
  Var *outVal_local;
  uint32 index_local;
  JavascriptNativeIntArray *this_local;
  
  this_00 = Memory::WriteBarrierPtr<Js::Type>::operator->
                      (&(this->super_JavascriptNativeArray).super_JavascriptArray.super_ArrayObject.
                        super_DynamicObject.super_RecyclableObject.type);
  requestContext_00 = Js::Type::GetScriptContext(this_00);
  val = GetItemQuery(this,this,index,outVal,requestContext_00);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  if (BVar1 == 0) {
    propertyObject = RecyclableObject::GetPrototype((RecyclableObject *)this);
    this_local._4_4_ =
         Js::JavascriptOperators::GetItem(this,propertyObject,index,outVal,requestContext_00);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptNativeIntArray::DirectGetItemAtFull(uint32 index, Var* outVal)
    {
        ScriptContext* requestContext = type->GetScriptContext();
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(JavascriptNativeIntArray::GetItemQuery(this, index, outVal, requestContext)))
        {
            return TRUE;
        }

        return JavascriptOperators::GetItem(this, this->GetPrototype(), index, outVal, requestContext);
    }